

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O1

int mpt_logfile_get(mpt_logfile *log,mpt_property *pr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  if (pr == (mpt_property *)0x0) {
    return 4;
  }
  pcVar2 = pr->name;
  if (pcVar2 == (char *)0x0) {
    pcVar4 = pr->desc;
LAB_00118724:
    if (pcVar2 == (char *)0x0) {
      pcVar3 = (char *)0x1;
      if (pcVar4 == (char *)0x0) goto LAB_0011876b;
    }
    else {
      iVar1 = strcasecmp(pcVar2,"file");
      if (iVar1 == 0) {
LAB_0011876b:
        pr->name = "file";
        pcVar2 = "output file descriptor";
        goto LAB_0011877c;
      }
      pcVar3 = (char *)0x0;
    }
    if (pcVar2 == (char *)0x0) {
      if (pcVar4 != pcVar3) {
        return -1;
      }
    }
    else {
      iVar1 = strcasecmp(pcVar2,"ignore");
      if (iVar1 != 0) {
        return -1;
      }
    }
    pr->name = "ignore";
    pr->desc = "output message filter";
    (pr->val)._type = 0x79;
    pr->_buf[0] = log->ignore;
    (pr->val)._addr = pr->_buf;
    bVar5 = log->ignore == '\b';
  }
  else {
    pcVar4 = (char *)0xffffffffffffffff;
    if (*pcVar2 != '\0') goto LAB_00118724;
    pr->name = "logfile";
    pcVar2 = "log message target";
LAB_0011877c:
    pr->desc = pcVar2;
    (pr->val)._type = 4;
    *(FILE **)pr->_buf = log->file;
    (pr->val)._addr = pr->_buf;
    bVar5 = log->file == (FILE *)0x0;
  }
  return (uint)!bVar5;
}

Assistant:

extern int mpt_logfile_get(const MPT_STRUCT(logfile) *log, MPT_STRUCT(property) *pr)
{
	const char *name;
	intptr_t pos = -1, id;
	
	if (!pr) {
		return MPT_ENUM(TypeFilePtr);
	}
	if (!(name = pr->name)) {
		pos = (intptr_t) pr->desc;
	}
	else if (!*name) {
		pr->name = "logfile";
		pr->desc = MPT_tr("log message target");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	id = 0;
	if (name ? (!strcasecmp(name, "file")) : pos == id++) {
		pr->name = "file";
		pr->desc = MPT_tr("output file descriptor");
		MPT_property_set_data(pr, MPT_ENUM(TypeFilePtr), &log->file);
		return log->file ? 1 : 0;
	}
	if (name ? !strcasecmp(name, "ignore") : pos == id++) {
		pr->name = "ignore";
		pr->desc = MPT_tr("output message filter");
		MPT_property_set_data(pr, 'y', &log->ignore);
		return log->ignore != MPT_LOG(Info) ? 1 : 0;
	}
	return MPT_ERROR(BadArgument);
}